

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O1

void __thiscall
NodeParser::parseInitQual
          (NodeParser *this,Node *node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  InputError *pIVar4;
  string local_70;
  string local_50;
  double local_30;
  double x;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(tokenList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    InputError::InputError(pIVar4,2,&local_70);
    __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
  }
  bVar3 = Utilities::parseNumber<double>(pbVar1 + 1,&local_30);
  if ((bVar3) && (0.0 <= local_30)) {
    node->initQual = local_30;
    return;
  }
  pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  InputError::InputError(pIVar4,6,&local_50);
  __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void NodeParser::parseInitQual(Node* node, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - node ID
    // 1 - initial quality concentration

    if ( tokenList.size() < 2 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    double x;
    if ( !Utilities::parseNumber(tokens[1], x) || x < 0.0)
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }
    node->initQual = x;
}